

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O0

uint32_t __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::tryB
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t b,uint32_t *in,uint32_t len)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  uint32_t in_ECX;
  Simple16<false> *in_RDX;
  int in_ESI;
  long in_RDI;
  size_t encodedExceptions_sz;
  uint32_t excVal;
  uint32_t excPos;
  uint32_t i_2;
  uint32_t gap;
  uint32_t prev;
  uint32_t cur;
  uint32_t i_1;
  uint32_t e;
  uint32_t i;
  uint32_t curExcept;
  uint32_t size;
  value_type local_70;
  int local_58;
  uint local_48;
  uint uVar5;
  undefined4 uVar6;
  uint in_stack_ffffffffffffffcc;
  uint uVar7;
  uint uVar8;
  uint32_t local_4;
  
  local_4 = in_ECX;
  if (in_ESI != 0x20) {
    local_4 = div_roundup(in_ECX * in_ESI,0x20);
    uVar8 = 0;
    uVar7 = 0;
    while (uVar7 < in_ECX) {
      uVar5 = uVar7;
      if ((uint)(1 << ((byte)in_ESI & 0x1f)) <=
          *(uint *)((long)&(in_RDX->super_IntegerCODEC)._vptr_IntegerCODEC + (ulong)uVar7 * 4)) {
        uVar3 = *(uint *)((long)&(in_RDX->super_IntegerCODEC)._vptr_IntegerCODEC + (ulong)uVar7 * 4)
                >> ((byte)in_ESI & 0x1f);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)uVar8);
        *pvVar4 = uVar7;
        in_stack_ffffffffffffffcc = uVar3;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28),
                            (ulong)uVar8);
        *pvVar4 = uVar3;
        uVar8 = uVar8 + 1;
      }
      uVar7 = uVar5 + 1;
    }
    uVar5 = uVar8;
    if (uVar8 != 0) {
      while (uVar5 = uVar5 - 1, uVar5 != 0) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)uVar5);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)(uVar5 - 1));
        vVar2 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)uVar5);
        *pvVar4 = vVar1 - vVar2;
      }
      uVar6 = 0;
      for (local_48 = 0; local_48 < uVar8; local_48 = local_48 + 1) {
        if (local_48 == 0) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10)
                              ,0);
          local_70 = *pvVar4;
        }
        else {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10)
                              ,(ulong)local_48);
          local_70 = *pvVar4 - 1;
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28),
                            (ulong)local_48);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x40),
                            (ulong)local_48);
        *pvVar4 = local_70;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x40),
                            (ulong)(local_48 + uVar8));
        *pvVar4 = vVar1 - 1;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x40),0);
      Simple16<false>::fakeencodeArray
                (in_RDX,(uint32_t *)CONCAT44(in_ECX,local_4),CONCAT44(uVar8,uVar7),
                 (size_t *)CONCAT44(in_stack_ffffffffffffffcc,uVar6));
      local_4 = local_58 + local_4;
    }
  }
  return local_4;
}

Assistant:

__attribute__((pure)) uint32_t
OPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(uint32_t b,
                                                          const uint32_t *in,
                                                          uint32_t len) {

  assert(b <= 32);
  if (b == 32) {
    return len;
  }
  uint32_t size = div_roundup(len * b, 32);
  uint32_t curExcept = 0;

  for (uint32_t i = 0; i < len; i++) {
    if (in[i] >= (1U << b)) {
      const uint32_t e = in[i] >> b;
      NewPFor<BlockSizeInUnitsOfPackSize,
              ExceptionCoder>::exceptionsPositions[curExcept] = i;
      NewPFor<BlockSizeInUnitsOfPackSize,
              ExceptionCoder>::exceptionsValues[curExcept] = e;
      curExcept++;
    }
  }

  if (curExcept > 0) {

    for (uint32_t i = curExcept - 1; i > 0; i--) {
      const uint32_t cur = NewPFor<BlockSizeInUnitsOfPackSize,
                                   ExceptionCoder>::exceptionsPositions[i];
      const uint32_t prev = NewPFor<BlockSizeInUnitsOfPackSize,
                                    ExceptionCoder>::exceptionsPositions[i - 1];
      const uint32_t gap = cur - prev;
      NewPFor<BlockSizeInUnitsOfPackSize,
              ExceptionCoder>::exceptionsPositions[i] = gap;
    }

    for (uint32_t i = 0; i < curExcept; i++) {
      const uint32_t excPos =
          (i > 0)
              ? NewPFor<BlockSizeInUnitsOfPackSize,
                        ExceptionCoder>::exceptionsPositions[i] -
                    1
              : NewPFor<BlockSizeInUnitsOfPackSize,
                        ExceptionCoder>::exceptionsPositions[i];
      const uint32_t excVal = NewPFor<BlockSizeInUnitsOfPackSize,
                                      ExceptionCoder>::exceptionsValues[i] -
                              1;
      NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::exceptions[i] =
          excPos;
      NewPFor<BlockSizeInUnitsOfPackSize,
              ExceptionCoder>::exceptions[i + curExcept] = excVal;
    }
    size_t encodedExceptions_sz;
    NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder.fakeencodeArray(
        &NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::exceptions[0],
        2 * curExcept, /*&encodedExceptions[0], */ encodedExceptions_sz);
    size += static_cast<uint32_t>(encodedExceptions_sz);
  }
  return size;
}